

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int64_t calculate_total_gf_group_bits(AV1_COMP *cpi,double gf_group_err)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long *in_RDI;
  double in_XMM0_Qa;
  int64_t total_group_bits;
  int max_bits;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  long local_48;
  long local_40;
  long local_38;
  
  lVar1 = *in_RDI;
  lVar2 = *in_RDI;
  iVar3 = frame_max_bits((RATE_CONTROL *)(in_RDI + 0xc0ee),(AV1EncoderConfig *)(in_RDI + 0x8464));
  if ((*(long *)(lVar2 + 0x8af8) < 1) || (*(double *)(lVar2 + 0x8b00) <= 0.0)) {
    local_38 = 0;
  }
  else {
    local_38 = (long)((double)*(long *)(lVar2 + 0x8af8) * (in_XMM0_Qa / *(double *)(lVar2 + 0x8b00))
                     );
  }
  if (local_38 < 0) {
    local_40 = 0;
  }
  else {
    if (*(long *)(lVar2 + 0x8af8) < local_38) {
      local_48 = *(long *)(lVar2 + 0x8af8);
    }
    else {
      local_48 = local_38;
    }
    local_40 = local_48;
  }
  local_38 = local_40;
  if ((long)iVar3 * (long)*(int *)(lVar1 + 0xac60) < local_40) {
    local_38 = (long)iVar3 * (long)*(int *)(lVar1 + 0xac60);
  }
  return local_38;
}

Assistant:

static int64_t calculate_total_gf_group_bits(AV1_COMP *cpi,
                                             double gf_group_err) {
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const TWO_PASS *const twopass = &cpi->ppi->twopass;
  const int max_bits = frame_max_bits(rc, &cpi->oxcf);
  int64_t total_group_bits;

  // Calculate the bits to be allocated to the group as a whole.
  if ((twopass->kf_group_bits > 0) && (twopass->kf_group_error_left > 0)) {
    total_group_bits = (int64_t)(twopass->kf_group_bits *
                                 (gf_group_err / twopass->kf_group_error_left));
  } else {
    total_group_bits = 0;
  }

  // Clamp odd edge cases.
  total_group_bits = (total_group_bits < 0) ? 0
                     : (total_group_bits > twopass->kf_group_bits)
                         ? twopass->kf_group_bits
                         : total_group_bits;

  // Clip based on user supplied data rate variability limit.
  if (total_group_bits > (int64_t)max_bits * p_rc->baseline_gf_interval)
    total_group_bits = (int64_t)max_bits * p_rc->baseline_gf_interval;

  return total_group_bits;
}